

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void DeCoalesce(VmInstruction *variable,VmFunction *function,VmInstruction *currIdom)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  VmInstruction *pVVar4;
  VmInstruction *pVVar5;
  
  if (currIdom != (VmInstruction *)0x0) {
    do {
      bVar1 = Dominates(currIdom,variable);
      if (bVar1) {
        if (currIdom->cmd == VM_INST_PARALLEL_COPY) {
          __assert_fail("inst->cmd != VM_INST_PARALLEL_COPY",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1cfa,"bool Uncolored(VmInstruction *)");
        }
        if (currIdom->color != 0) {
          variable->idom = currIdom;
          variable->intersectingIdom = (VmInstruction *)0x0;
          do {
            if (currIdom->cmd == VM_INST_PARALLEL_COPY) {
              __assert_fail("inst->cmd != VM_INST_PARALLEL_COPY",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1cf3,"bool Colored(VmInstruction *)");
            }
            if ((currIdom->color != 0) && (bVar1 = Intersect(currIdom,variable), bVar1)) {
              pVVar4 = UnderlyingValue(currIdom);
              pVVar5 = UnderlyingValue(variable);
              if (pVVar4 == pVVar5) {
                variable->intersectingIdom = currIdom;
                return;
              }
              uVar3 = function->nextSearchMarker;
              function->nextSearchMarker = uVar3 + 1;
              uVar2 = GetSplitCopyCount(variable,uVar3);
              uVar3 = function->nextSearchMarker;
              function->nextSearchMarker = uVar3 + 1;
              uVar3 = GetSplitCopyCount(currIdom,uVar3);
              if ((uVar2 < uVar3) || (variable->color == 0)) {
                UncolorAtomicMergeSet(variable);
                return;
              }
              UncolorAtomicMergeSet(currIdom);
            }
            currIdom = currIdom->intersectingIdom;
            if (currIdom == (VmInstruction *)0x0) {
              return;
            }
          } while( true );
        }
      }
      currIdom = currIdom->idom;
    } while (currIdom != (VmInstruction *)0x0);
  }
  variable->idom = (VmInstruction *)0x0;
  variable->intersectingIdom = (VmInstruction *)0x0;
  return;
}

Assistant:

void DeCoalesce(VmInstruction *variable, VmFunction* function, VmInstruction *currIdom)
{
	while(currIdom != NULL && (!Dominates(currIdom, variable) || Uncolored(currIdom)))
		currIdom = currIdom->idom;

	variable->idom = currIdom;
	variable->intersectingIdom = NULL;

	VmInstruction *currAncestor = variable->idom;

	while(currAncestor)
	{
		while(currAncestor && !(Colored(currAncestor) && Intersect(currAncestor, variable)))
			currAncestor = currAncestor->intersectingIdom;

		if(currAncestor)
		{
			if(UnderlyingValue(currAncestor) == UnderlyingValue(variable))
			{
				variable->intersectingIdom = currAncestor;
				break;
			}
			else
			{
				unsigned variableCopyCount = GetSplitCopyCount(variable, function->nextSearchMarker++);
				unsigned currAncestoreCopyCount = GetSplitCopyCount(currAncestor, function->nextSearchMarker++);

				// v and currAnc interfere
				// It's preferable to uncolor a variable that is already uncolored or a variable that will split the lesser number of copies
				if(variable->color == 0 || variableCopyCount < currAncestoreCopyCount)
				{
					UncolorAtomicMergeSet(variable);

					break;
				}
				else
				{
					UncolorAtomicMergeSet(currAncestor);

					currAncestor = currAncestor->intersectingIdom;
				}
			}
		}
	}
}